

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  mz_bool mVar1;
  mz_uint16 in_stack_0000014e;
  void *in_stack_00000150;
  size_t in_stack_00000158;
  void *in_stack_00000160;
  char *in_stack_00000168;
  mz_zip_archive *in_stack_00000170;
  mz_uint in_stack_00000420;
  mz_uint64 in_stack_00000428;
  mz_uint32 in_stack_00000430;
  time_t *in_stack_00000438;
  char *in_stack_00000440;
  mz_uint in_stack_00000448;
  char *in_stack_00000450;
  mz_uint in_stack_00000458;
  
  mVar1 = mz_zip_writer_add_mem_ex_v2
                    (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                     in_stack_00000150,in_stack_0000014e,in_stack_00000420,in_stack_00000428,
                     in_stack_00000430,in_stack_00000438,in_stack_00000440,in_stack_00000448,
                     in_stack_00000450,in_stack_00000458);
  return mVar1;
}

Assistant:

inline mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive* pZip,
                                        const char* pArchive_name,
                                        const void* pBuf,
                                        size_t buf_size,
                                        const void* pComment,
                                        mz_uint16 comment_size,
                                        mz_uint level_and_flags,
                                        mz_uint64 uncomp_size,
                                        mz_uint32 uncomp_crc32) {

    return mz_zip_writer_add_mem_ex_v2(pZip,
                                       pArchive_name,
                                       pBuf,
                                       buf_size,
                                       pComment,
                                       comment_size,
                                       level_and_flags,
                                       uncomp_size,
                                       uncomp_crc32,
                                       NULL,
                                       NULL,
                                       0,
                                       NULL,
                                       0);
}